

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_timesplit_array.h
# Opt level: O1

void __thiscall
embree::sse2::
HeuristicMBlurTemporalSplit<embree::PrimRefMB,_embree::sse2::SubdivRecalculatePrimRef,_2UL>::
TemporalBinInfo::bin
          (TemporalBinInfo *this,PrimRefMB *prims,size_t begin,size_t end,BBox1f time_range,
          SetMB *set,SubdivRecalculatePrimRef *recalculatePrimRef)

{
  BBox<embree::Vec3fa> *pBVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  float *pfVar12;
  long lVar13;
  long lVar14;
  size_t i;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar23;
  undefined1 auVar19 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar27;
  undefined1 auVar24 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar25;
  undefined1 auVar26 [16];
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar35;
  float fVar36;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar33;
  undefined1 auVar34 [16];
  float fVar37;
  float fVar38;
  float fVar41;
  float fVar42;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar39;
  undefined1 auVar40 [16];
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar49;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar50;
  
  fVar15 = time_range.lower;
  fVar23 = time_range.upper;
  fVar30 = (set->super_PrimInfoMB).max_time_range.lower;
  fVar29 = (set->super_PrimInfoMB).max_time_range.upper - fVar30;
  fVar17 = (float)(set->super_PrimInfoMB).max_num_time_segments;
  fVar16 = roundf((((fVar15 * 0.5 + fVar23 * 0.5) - fVar30) / fVar29) * fVar17);
  fVar30 = (fVar16 / fVar17) * fVar29 + fVar30;
  if (begin < end && !(bool)(~(fVar15 < fVar30 && fVar30 < fVar23) & 1)) {
    do {
      if ((fVar15 < prims[begin].time_range.upper * 0.9999) &&
         (prims[begin].time_range.lower * 1.0001 < fVar30)) {
        fVar38 = (float)(uint)prims[begin].lbounds.bounds1.upper.field_0.m128[3];
        fVar16 = prims[begin].time_range.lower;
        fVar29 = prims[begin].time_range.upper - fVar16;
        fVar32 = (fVar15 - fVar16) / fVar29;
        fVar29 = (fVar30 - fVar16) / fVar29;
        fVar31 = fVar29 * fVar38;
        fVar16 = floorf(fVar32 * fVar38);
        fVar17 = ceilf(fVar31);
        iVar9 = (int)fVar16;
        if (fVar16 <= 0.0) {
          fVar16 = 0.0;
        }
        fVar18 = fVar17;
        if (fVar38 <= fVar17) {
          fVar18 = fVar38;
        }
        if (iVar9 < 0) {
          iVar9 = -1;
        }
        uVar4 = (int)fVar38 + 1U;
        if ((int)fVar17 < (int)((int)fVar38 + 1U)) {
          uVar4 = (int)fVar17;
        }
        lVar14 = (long)(int)fVar16;
        pBVar1 = recalculatePrimRef->bounds->items;
        uVar11 = (ulong)(uint)prims[begin].lbounds.bounds0.upper.field_0.m128[3] << 0x25 |
                 (ulong)(uint)prims[begin].lbounds.bounds0.lower.field_0.m128[3] << 5;
        pfVar12 = (float *)((long)&pBVar1[lVar14].lower.field_0 + uVar11);
        fVar17 = *pfVar12;
        fVar50 = pfVar12[1];
        fVar27 = pfVar12[2];
        fVar28 = pfVar12[3];
        pfVar12 = (float *)((long)&pBVar1[lVar14].upper.field_0 + uVar11);
        fVar35 = *pfVar12;
        fVar36 = pfVar12[1];
        fVar37 = pfVar12[2];
        fVar41 = pfVar12[3];
        lVar13 = (long)(int)fVar18;
        pfVar12 = (float *)((long)&pBVar1[lVar13].lower.field_0 + uVar11);
        fVar42 = *pfVar12;
        fVar43 = pfVar12[1];
        fVar45 = pfVar12[2];
        fVar49 = pfVar12[3];
        pfVar12 = (float *)((long)&pBVar1[lVar13].upper.field_0 + uVar11);
        fVar5 = *pfVar12;
        fVar6 = pfVar12[1];
        fVar7 = pfVar12[2];
        fVar8 = pfVar12[3];
        fVar16 = fVar32 * fVar38 - fVar16;
        if (fVar16 <= 0.0) {
          fVar16 = 0.0;
        }
        fVar44 = 1.0 - fVar16;
        if (uVar4 - iVar9 == 1) {
          auVar48._4_4_ = fVar50 * fVar44 + fVar43 * fVar16;
          auVar48._0_4_ = fVar17 * fVar44 + fVar42 * fVar16;
          fVar18 = fVar18 - fVar31;
          if (fVar18 <= 0.0) {
            fVar18 = 0.0;
          }
          fVar29 = 1.0 - fVar18;
          auVar24._0_4_ = fVar42 * fVar29 + fVar17 * fVar18;
          auVar24._4_4_ = fVar43 * fVar29 + fVar50 * fVar18;
          auVar24._8_4_ = fVar45 * fVar29 + fVar27 * fVar18;
          auVar24._12_4_ = fVar49 * fVar29 + fVar28 * fVar18;
          fVar17 = fVar29 * fVar5 + fVar18 * fVar35;
          fVar31 = fVar29 * fVar6 + fVar18 * fVar36;
          fVar50 = fVar29 * fVar7 + fVar18 * fVar37;
          fVar18 = fVar29 * fVar8 + fVar18 * fVar41;
          auVar22._4_4_ = fVar44 * fVar36 + fVar16 * fVar6;
          auVar22._0_4_ = fVar44 * fVar35 + fVar16 * fVar5;
          auVar22._8_4_ = fVar44 * fVar37 + fVar16 * fVar7;
          auVar22._12_4_ = fVar44 * fVar41 + fVar16 * fVar8;
          auVar48._8_4_ = fVar27 * fVar44 + fVar45 * fVar16;
          auVar48._12_4_ = fVar28 * fVar44 + fVar49 * fVar16;
        }
        else {
          pfVar12 = (float *)((long)&pBVar1[lVar14 + 1].lower.field_0 + uVar11);
          auVar48._0_4_ = fVar17 * fVar44 + *pfVar12 * fVar16;
          auVar48._4_4_ = fVar50 * fVar44 + pfVar12[1] * fVar16;
          auVar48._8_4_ = fVar27 * fVar44 + pfVar12[2] * fVar16;
          auVar48._12_4_ = fVar28 * fVar44 + pfVar12[3] * fVar16;
          pfVar12 = (float *)((long)&pBVar1[lVar14 + 1].upper.field_0 + uVar11);
          auVar22._0_4_ = fVar35 * fVar44 + fVar16 * *pfVar12;
          auVar22._4_4_ = fVar36 * fVar44 + fVar16 * pfVar12[1];
          auVar22._8_4_ = fVar37 * fVar44 + fVar16 * pfVar12[2];
          auVar22._12_4_ = fVar41 * fVar44 + fVar16 * pfVar12[3];
          fVar18 = fVar18 - fVar31;
          if (fVar18 <= 0.0) {
            fVar18 = 0.0;
          }
          fVar16 = 1.0 - fVar18;
          pfVar12 = (float *)((long)&pBVar1[lVar13 + -1].lower.field_0 + uVar11);
          auVar24._0_4_ = fVar42 * fVar16 + *pfVar12 * fVar18;
          auVar24._4_4_ = fVar43 * fVar16 + pfVar12[1] * fVar18;
          auVar24._8_4_ = fVar45 * fVar16 + pfVar12[2] * fVar18;
          auVar24._12_4_ = fVar49 * fVar16 + pfVar12[3] * fVar18;
          pfVar12 = (float *)((long)pBVar1 + lVar13 * 0x20 + (uVar11 - 0x10));
          fVar17 = fVar5 * fVar16 + fVar18 * *pfVar12;
          fVar31 = fVar6 * fVar16 + fVar18 * pfVar12[1];
          fVar50 = fVar7 * fVar16 + fVar18 * pfVar12[2];
          fVar18 = fVar8 * fVar16 + fVar18 * pfVar12[3];
          uVar10 = iVar9 + 1;
          if ((int)uVar10 < (int)uVar4) {
            pfVar12 = (float *)((long)&pBVar1[uVar10].upper.field_0 + uVar11);
            do {
              fVar16 = ((float)(int)uVar10 / fVar38 - fVar32) / (fVar29 - fVar32);
              fVar45 = 1.0 - fVar16;
              fVar27 = auVar24._4_4_;
              fVar28 = auVar24._12_4_;
              fVar49 = auVar24._8_4_;
              fVar41 = auVar48._4_4_;
              fVar42 = auVar48._8_4_;
              fVar43 = auVar48._12_4_;
              fVar35 = auVar22._4_4_;
              fVar36 = auVar22._8_4_;
              fVar37 = auVar22._12_4_;
              auVar19._0_4_ = pfVar12[-4] - (auVar48._0_4_ * fVar45 + auVar24._0_4_ * fVar16);
              auVar19._4_4_ = pfVar12[-3] - (fVar41 * fVar45 + fVar27 * fVar16);
              auVar19._8_4_ = pfVar12[-2] - (fVar42 * fVar45 + fVar49 * fVar16);
              auVar19._12_4_ = pfVar12[-1] - (fVar43 * fVar45 + fVar28 * fVar16);
              auVar46._0_4_ = *pfVar12 - (fVar45 * auVar22._0_4_ + fVar16 * fVar17);
              auVar46._4_4_ = pfVar12[1] - (fVar45 * fVar35 + fVar16 * fVar31);
              auVar46._8_4_ = pfVar12[2] - (fVar45 * fVar36 + fVar16 * fVar50);
              auVar46._12_4_ = pfVar12[3] - (fVar45 * fVar37 + fVar16 * fVar18);
              auVar19 = minps(auVar19,ZEXT816(0));
              auVar46 = maxps(auVar46,ZEXT816(0));
              auVar48._0_4_ = auVar48._0_4_ + auVar19._0_4_;
              auVar48._4_4_ = fVar41 + auVar19._4_4_;
              auVar48._8_4_ = fVar42 + auVar19._8_4_;
              auVar48._12_4_ = fVar43 + auVar19._12_4_;
              auVar24._0_4_ = auVar24._0_4_ + auVar19._0_4_;
              auVar24._4_4_ = fVar27 + auVar19._4_4_;
              auVar24._8_4_ = fVar49 + auVar19._8_4_;
              auVar24._12_4_ = fVar28 + auVar19._12_4_;
              auVar22._0_4_ = auVar22._0_4_ + auVar46._0_4_;
              auVar22._4_4_ = fVar35 + auVar46._4_4_;
              auVar22._8_4_ = fVar36 + auVar46._8_4_;
              auVar22._12_4_ = fVar37 + auVar46._12_4_;
              fVar17 = fVar17 + auVar46._0_4_;
              fVar31 = fVar31 + auVar46._4_4_;
              fVar50 = fVar50 + auVar46._8_4_;
              fVar18 = fVar18 + auVar46._12_4_;
              uVar10 = uVar10 + 1;
              pfVar12 = pfVar12 + 8;
            } while (uVar4 != uVar10);
          }
        }
        aVar20.m128 = (__m128)minps(this->bounds0[0].bounds0.lower.field_0,auVar48);
        aVar39.m128 = (__m128)maxps(this->bounds0[0].bounds0.upper.field_0,auVar22);
        aVar33.m128 = (__m128)minps(this->bounds0[0].bounds1.lower.field_0,auVar24);
        auVar2._4_4_ = fVar31;
        auVar2._0_4_ = fVar17;
        auVar2._8_4_ = fVar50;
        auVar2._12_4_ = fVar18;
        aVar25.m128 = (__m128)maxps(this->bounds0[0].bounds1.upper.field_0,auVar2);
        this->bounds0[0].bounds0.lower.field_0 = aVar20;
        this->bounds0[0].bounds0.upper.field_0 = aVar39;
        this->bounds0[0].bounds1.lower.field_0 = aVar33;
        this->bounds0[0].bounds1.upper.field_0 = aVar25;
        fVar32 = (float)(uint)prims[begin].lbounds.bounds1.upper.field_0.m128[3];
        fVar29 = prims[begin].time_range.lower;
        fVar31 = prims[begin].time_range.upper - fVar29;
        fVar17 = floorf(((fVar15 - fVar29) / fVar31) * 1.0000002 * fVar32);
        fVar16 = 0.0;
        if (0.0 <= fVar17) {
          fVar16 = fVar17;
        }
        fVar17 = ceilf(((fVar30 - fVar29) / fVar31) * 0.99999976 * fVar32);
        if (fVar32 <= fVar17) {
          fVar17 = fVar32;
        }
        this->count0[0] = this->count0[0] + (long)((int)fVar17 - (int)fVar16);
      }
      if ((fVar30 < prims[begin].time_range.upper * 0.9999) &&
         (prims[begin].time_range.lower * 1.0001 < fVar23)) {
        fVar38 = (float)(uint)prims[begin].lbounds.bounds1.upper.field_0.m128[3];
        fVar16 = prims[begin].time_range.lower;
        fVar29 = prims[begin].time_range.upper - fVar16;
        fVar32 = (fVar30 - fVar16) / fVar29;
        fVar29 = (fVar23 - fVar16) / fVar29;
        fVar31 = fVar29 * fVar38;
        fVar16 = floorf(fVar32 * fVar38);
        fVar17 = ceilf(fVar31);
        iVar9 = (int)fVar16;
        if (fVar16 <= 0.0) {
          fVar16 = 0.0;
        }
        fVar18 = fVar17;
        if (fVar38 <= fVar17) {
          fVar18 = fVar38;
        }
        if (iVar9 < 0) {
          iVar9 = -1;
        }
        uVar4 = (int)fVar38 + 1U;
        if ((int)fVar17 < (int)((int)fVar38 + 1U)) {
          uVar4 = (int)fVar17;
        }
        lVar14 = (long)(int)fVar16;
        pBVar1 = recalculatePrimRef->bounds->items;
        uVar11 = (ulong)(uint)prims[begin].lbounds.bounds0.upper.field_0.m128[3] << 0x25 |
                 (ulong)(uint)prims[begin].lbounds.bounds0.lower.field_0.m128[3] << 5;
        pfVar12 = (float *)((long)&pBVar1[lVar14].lower.field_0 + uVar11);
        fVar17 = *pfVar12;
        fVar50 = pfVar12[1];
        fVar27 = pfVar12[2];
        fVar28 = pfVar12[3];
        pfVar12 = (float *)((long)&pBVar1[lVar14].upper.field_0 + uVar11);
        fVar35 = *pfVar12;
        fVar36 = pfVar12[1];
        fVar37 = pfVar12[2];
        fVar41 = pfVar12[3];
        lVar13 = (long)(int)fVar18;
        pfVar12 = (float *)((long)&pBVar1[lVar13].lower.field_0 + uVar11);
        fVar42 = *pfVar12;
        fVar43 = pfVar12[1];
        fVar45 = pfVar12[2];
        fVar49 = pfVar12[3];
        pfVar12 = (float *)((long)&pBVar1[lVar13].upper.field_0 + uVar11);
        fVar5 = *pfVar12;
        fVar6 = pfVar12[1];
        fVar7 = pfVar12[2];
        fVar8 = pfVar12[3];
        fVar16 = fVar32 * fVar38 - fVar16;
        if (fVar16 <= 0.0) {
          fVar16 = 0.0;
        }
        fVar44 = 1.0 - fVar16;
        if (uVar4 - iVar9 == 1) {
          auVar40._4_4_ = fVar50 * fVar44 + fVar43 * fVar16;
          auVar40._0_4_ = fVar17 * fVar44 + fVar42 * fVar16;
          fVar18 = fVar18 - fVar31;
          if (fVar18 <= 0.0) {
            fVar18 = 0.0;
          }
          fVar29 = 1.0 - fVar18;
          auVar26._0_4_ = fVar42 * fVar29 + fVar17 * fVar18;
          auVar26._4_4_ = fVar43 * fVar29 + fVar50 * fVar18;
          auVar26._8_4_ = fVar45 * fVar29 + fVar27 * fVar18;
          auVar26._12_4_ = fVar49 * fVar29 + fVar28 * fVar18;
          fVar17 = fVar29 * fVar5 + fVar18 * fVar35;
          fVar31 = fVar29 * fVar6 + fVar18 * fVar36;
          fVar50 = fVar29 * fVar7 + fVar18 * fVar37;
          fVar18 = fVar29 * fVar8 + fVar18 * fVar41;
          auVar34._4_4_ = fVar44 * fVar36 + fVar16 * fVar6;
          auVar34._0_4_ = fVar44 * fVar35 + fVar16 * fVar5;
          auVar34._8_4_ = fVar44 * fVar37 + fVar16 * fVar7;
          auVar34._12_4_ = fVar44 * fVar41 + fVar16 * fVar8;
          auVar40._8_4_ = fVar27 * fVar44 + fVar45 * fVar16;
          auVar40._12_4_ = fVar28 * fVar44 + fVar49 * fVar16;
        }
        else {
          pfVar12 = (float *)((long)&pBVar1[lVar14 + 1].lower.field_0 + uVar11);
          auVar40._0_4_ = fVar17 * fVar44 + *pfVar12 * fVar16;
          auVar40._4_4_ = fVar50 * fVar44 + pfVar12[1] * fVar16;
          auVar40._8_4_ = fVar27 * fVar44 + pfVar12[2] * fVar16;
          auVar40._12_4_ = fVar28 * fVar44 + pfVar12[3] * fVar16;
          pfVar12 = (float *)((long)&pBVar1[lVar14 + 1].upper.field_0 + uVar11);
          auVar34._0_4_ = fVar35 * fVar44 + fVar16 * *pfVar12;
          auVar34._4_4_ = fVar36 * fVar44 + fVar16 * pfVar12[1];
          auVar34._8_4_ = fVar37 * fVar44 + fVar16 * pfVar12[2];
          auVar34._12_4_ = fVar41 * fVar44 + fVar16 * pfVar12[3];
          fVar18 = fVar18 - fVar31;
          if (fVar18 <= 0.0) {
            fVar18 = 0.0;
          }
          fVar16 = 1.0 - fVar18;
          pfVar12 = (float *)((long)&pBVar1[lVar13 + -1].lower.field_0 + uVar11);
          auVar26._0_4_ = fVar42 * fVar16 + *pfVar12 * fVar18;
          auVar26._4_4_ = fVar43 * fVar16 + pfVar12[1] * fVar18;
          auVar26._8_4_ = fVar45 * fVar16 + pfVar12[2] * fVar18;
          auVar26._12_4_ = fVar49 * fVar16 + pfVar12[3] * fVar18;
          pfVar12 = (float *)((long)pBVar1 + lVar13 * 0x20 + (uVar11 - 0x10));
          fVar17 = fVar5 * fVar16 + fVar18 * *pfVar12;
          fVar31 = fVar6 * fVar16 + fVar18 * pfVar12[1];
          fVar50 = fVar7 * fVar16 + fVar18 * pfVar12[2];
          fVar18 = fVar8 * fVar16 + fVar18 * pfVar12[3];
          uVar10 = iVar9 + 1;
          if ((int)uVar10 < (int)uVar4) {
            pfVar12 = (float *)((long)&pBVar1[uVar10].upper.field_0 + uVar11);
            do {
              fVar16 = ((float)(int)uVar10 / fVar38 - fVar32) / (fVar29 - fVar32);
              fVar45 = 1.0 - fVar16;
              fVar27 = auVar26._4_4_;
              fVar28 = auVar26._12_4_;
              fVar49 = auVar26._8_4_;
              fVar41 = auVar40._4_4_;
              fVar42 = auVar40._8_4_;
              fVar43 = auVar40._12_4_;
              fVar35 = auVar34._4_4_;
              fVar36 = auVar34._8_4_;
              fVar37 = auVar34._12_4_;
              auVar21._0_4_ = pfVar12[-4] - (auVar40._0_4_ * fVar45 + auVar26._0_4_ * fVar16);
              auVar21._4_4_ = pfVar12[-3] - (fVar41 * fVar45 + fVar27 * fVar16);
              auVar21._8_4_ = pfVar12[-2] - (fVar42 * fVar45 + fVar49 * fVar16);
              auVar21._12_4_ = pfVar12[-1] - (fVar43 * fVar45 + fVar28 * fVar16);
              auVar47._0_4_ = *pfVar12 - (fVar45 * auVar34._0_4_ + fVar16 * fVar17);
              auVar47._4_4_ = pfVar12[1] - (fVar45 * fVar35 + fVar16 * fVar31);
              auVar47._8_4_ = pfVar12[2] - (fVar45 * fVar36 + fVar16 * fVar50);
              auVar47._12_4_ = pfVar12[3] - (fVar45 * fVar37 + fVar16 * fVar18);
              auVar22 = minps(auVar21,ZEXT816(0));
              auVar48 = maxps(auVar47,ZEXT816(0));
              auVar40._0_4_ = auVar40._0_4_ + auVar22._0_4_;
              auVar40._4_4_ = fVar41 + auVar22._4_4_;
              auVar40._8_4_ = fVar42 + auVar22._8_4_;
              auVar40._12_4_ = fVar43 + auVar22._12_4_;
              auVar26._0_4_ = auVar26._0_4_ + auVar22._0_4_;
              auVar26._4_4_ = fVar27 + auVar22._4_4_;
              auVar26._8_4_ = fVar49 + auVar22._8_4_;
              auVar26._12_4_ = fVar28 + auVar22._12_4_;
              auVar34._0_4_ = auVar34._0_4_ + auVar48._0_4_;
              auVar34._4_4_ = fVar35 + auVar48._4_4_;
              auVar34._8_4_ = fVar36 + auVar48._8_4_;
              auVar34._12_4_ = fVar37 + auVar48._12_4_;
              fVar17 = fVar17 + auVar48._0_4_;
              fVar31 = fVar31 + auVar48._4_4_;
              fVar50 = fVar50 + auVar48._8_4_;
              fVar18 = fVar18 + auVar48._12_4_;
              uVar10 = uVar10 + 1;
              pfVar12 = pfVar12 + 8;
            } while (uVar4 != uVar10);
          }
        }
        aVar20.m128 = (__m128)minps(this->bounds1[0].bounds0.lower.field_0,auVar40);
        aVar39.m128 = (__m128)maxps(this->bounds1[0].bounds0.upper.field_0,auVar34);
        aVar33.m128 = (__m128)minps(this->bounds1[0].bounds1.lower.field_0,auVar26);
        auVar3._4_4_ = fVar31;
        auVar3._0_4_ = fVar17;
        auVar3._8_4_ = fVar50;
        auVar3._12_4_ = fVar18;
        aVar25.m128 = (__m128)maxps(this->bounds1[0].bounds1.upper.field_0,auVar3);
        this->bounds1[0].bounds0.lower.field_0 = aVar20;
        this->bounds1[0].bounds0.upper.field_0 = aVar39;
        this->bounds1[0].bounds1.lower.field_0 = aVar33;
        this->bounds1[0].bounds1.upper.field_0 = aVar25;
        fVar32 = (float)(uint)prims[begin].lbounds.bounds1.upper.field_0.m128[3];
        fVar29 = prims[begin].time_range.lower;
        fVar31 = prims[begin].time_range.upper - fVar29;
        fVar17 = floorf(((fVar30 - fVar29) / fVar31) * 1.0000002 * fVar32);
        fVar16 = 0.0;
        if (0.0 <= fVar17) {
          fVar16 = fVar17;
        }
        fVar17 = ceilf(((fVar23 - fVar29) / fVar31) * 0.99999976 * fVar32);
        if (fVar32 <= fVar17) {
          fVar17 = fVar32;
        }
        this->count1[0] = this->count1[0] + (long)((int)fVar17 - (int)fVar16);
      }
      begin = begin + 1;
    } while (begin != end);
  }
  return;
}

Assistant:

void bin(const PrimRefMB* prims, size_t begin, size_t end, BBox1f time_range, const SetMB& set, const RecalculatePrimRef& recalculatePrimRef)
          {
            for (int b=0; b<BINS-1; b++)
            {
              const float t = float(b+1)/float(BINS);
              const float ct = lerp(time_range.lower,time_range.upper,t);
              const float center_time = set.align_time(ct);
              if (center_time <= time_range.lower) continue;
              if (center_time >= time_range.upper) continue;
              const BBox1f dt0(time_range.lower,center_time);
              const BBox1f dt1(center_time,time_range.upper);
              
              /* find linear bounds for both time segments */
              for (size_t i=begin; i<end; i++) 
              {
                if (prims[i].time_range_overlap(dt0))
                {
                  const LBBox3fa bn0 = recalculatePrimRef.linearBounds(prims[i],dt0);
#if MBLUR_BIN_LBBOX
                  bounds0[b].extend(bn0);
#else
                  bounds0[b].extend(bn0.interpolate(0.5f));
#endif
                  count0[b] += prims[i].timeSegmentRange(dt0).size();
                }

                if (prims[i].time_range_overlap(dt1))
                {
                  const LBBox3fa bn1 = recalculatePrimRef.linearBounds(prims[i],dt1);
#if MBLUR_BIN_LBBOX
                  bounds1[b].extend(bn1);
#else
                  bounds1[b].extend(bn1.interpolate(0.5f));
#endif
                  count1[b] += prims[i].timeSegmentRange(dt1).size();
                }
              }
            }
          }